

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.cpp
# Opt level: O2

void __thiscall
duckdb::GetIgnoredCodepoints
          (duckdb *this,string_t ignored,
          unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
          *ignored_codepoints)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  utf8proc_int32_t codepoint;
  int local_3c;
  undefined8 local_38;
  long local_30;
  
  local_30 = ignored.value._0_8_;
  lVar1 = local_30;
  if ((uint)this < 0xd) {
    lVar1 = (long)&local_38 + 4;
  }
  local_38 = this;
  for (uVar3 = 0; lVar2 = ((ulong)this & 0xffffffff) - uVar3,
      uVar3 <= ((ulong)this & 0xffffffff) && lVar2 != 0; uVar3 = uVar3 + lVar2) {
    lVar2 = duckdb::utf8proc_iterate((uchar *)(lVar1 + uVar3),lVar2,&local_3c);
    std::__detail::
    _Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert(ignored.value._8_8_,&local_3c);
  }
  return;
}

Assistant:

static void GetIgnoredCodepoints(string_t ignored, unordered_set<utf8proc_int32_t> &ignored_codepoints) {
	auto dataptr = reinterpret_cast<const utf8proc_uint8_t *>(ignored.GetData());
	auto size = ignored.GetSize();
	idx_t pos = 0;
	while (pos < size) {
		utf8proc_int32_t codepoint;
		pos += UnsafeNumericCast<idx_t>(
		    utf8proc_iterate(dataptr + pos, UnsafeNumericCast<utf8proc_ssize_t>(size - pos), &codepoint));
		ignored_codepoints.insert(codepoint);
	}
}